

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManPrintOne(FILE *pFile,If_DsdMan_t *p,int iObjId,uchar *pPermLits,int fNewLine)

{
  uint in_EAX;
  int nSupp;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  fprintf((FILE *)pFile,"%6d : ");
  if ((-1 < iObjId) && (iObjId < (p->vObjs).nSize)) {
    fprintf((FILE *)pFile,"%2d ",
            (ulong)(*(uint *)((long)(p->vObjs).pArray[(uint)iObjId] + 4) >> 3 & 0x1f));
    if (iObjId < (p->vObjs).nSize) {
      fprintf((FILE *)pFile,"%8d ",
              (ulong)(*(uint *)((long)(p->vObjs).pArray[(uint)iObjId] + 4) >> 9 & 0x3ffff));
      if (iObjId < (p->vObjs).nSize) {
        fprintf((FILE *)pFile,"%d  ",
                (ulong)(*(uint *)((long)(p->vObjs).pArray[(uint)iObjId] + 4) >> 8 & 1));
        If_DsdManPrint_rec(pFile,p,iObjId * 2,pPermLits,(int *)((long)&uStack_38 + 4));
        if (fNewLine != 0) {
          fputc(10,(FILE *)pFile);
        }
        if (iObjId < (p->vObjs).nSize) {
          if (uStack_38._4_4_ == (*(uint *)((long)(p->vObjs).pArray[(uint)iObjId] + 4) >> 3 & 0x1f))
          {
            return;
          }
          __assert_fail("nSupp == If_DsdVecObjSuppSize(&p->vObjs, iObjId)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0x207,
                        "void If_DsdManPrintOne(FILE *, If_DsdMan_t *, int, unsigned char *, int)");
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void If_DsdManPrintOne( FILE * pFile, If_DsdMan_t * p, int iObjId, unsigned char * pPermLits, int fNewLine )
{
    int nSupp = 0;
    fprintf( pFile, "%6d : ", iObjId );
    fprintf( pFile, "%2d ",   If_DsdVecObjSuppSize(&p->vObjs, iObjId) );
    fprintf( pFile, "%8d ",   If_DsdVecObjRef(&p->vObjs, iObjId) );
    fprintf( pFile, "%d  ",    If_DsdVecObjMark(&p->vObjs, iObjId) );
    If_DsdManPrint_rec( pFile, p, Abc_Var2Lit(iObjId, 0), pPermLits, &nSupp );
    if ( fNewLine )
        fprintf( pFile, "\n" );
    assert( nSupp == If_DsdVecObjSuppSize(&p->vObjs, iObjId) );
}